

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.cpp
# Opt level: O2

void __thiscall aeron::Publication::~Publication(Publication *this)

{
  long lVar1;
  
  this->_vptr_Publication = (_func_int **)&PTR__Publication_0016ec68;
  ClientConductor::releasePublication(this->m_conductor,this->m_registrationId);
  lVar1 = 0;
  do {
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::~unique_ptr((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                   *)((long)&this->m_appenders[2]._M_t.
                             super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                             .
                             super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>
                             ._M_head_impl + lVar1));
    lVar1 = lVar1 + -8;
  } while (lVar1 != -0x18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&this->m_channel);
  return;
}

Assistant:

Publication::~Publication()
{
    m_conductor.releasePublication(m_registrationId);
}